

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurlquery.cpp
# Opt level: O2

iterator __thiscall QUrlQueryPrivate::findKey(QUrlQueryPrivate *this,QString *key)

{
  int iVar1;
  iterator iVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = QList<std::pair<QString,_QString>_>::begin(&this->itemList);
  recodeFromUser((QString *)&QStack_48,this,key);
  iVar1 = findRecodedKey(this,(QString *)&QStack_48,0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (iterator)(iVar2.i + iVar1);
  }
  __stack_chk_fail();
}

Assistant:

Map::iterator findKey(const QString &key)
    { return itemList.begin() + findRecodedKey(recodeFromUser(key)); }